

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_read_mcc(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  bool bVar1;
  uint uVar2;
  opj_mct_data_t *poVar3;
  opj_tcp_t *local_78;
  opj_simple_mcc_decorrelation_data_t *new_mcc_records;
  OPJ_BOOL l_new_mcc;
  OPJ_UINT32 l_nb_bytes_by_comp;
  OPJ_UINT32 l_nb_comps;
  OPJ_UINT32 l_nb_collections;
  opj_mct_data_t *l_mct_data;
  opj_simple_mcc_decorrelation_data_t *l_mcc_record;
  opj_tcp_t *l_tcp;
  OPJ_UINT32 l_indix;
  OPJ_UINT32 l_tmp;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  opj_event_mgr_t *p_manager_local;
  OPJ_BYTE *pOStack_20;
  OPJ_UINT32 p_header_size_local;
  OPJ_BYTE *p_header_data_local;
  opj_j2k_t *p_j2k_local;
  
  bVar1 = false;
  _j = p_manager;
  p_manager_local._4_4_ = p_header_size;
  pOStack_20 = p_header_data;
  p_header_data_local = (OPJ_BYTE *)p_j2k;
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x16db,
                  "OPJ_BOOL opj_j2k_read_mcc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x16dc,
                  "OPJ_BOOL opj_j2k_read_mcc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x16dd,
                  "OPJ_BOOL opj_j2k_read_mcc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    local_78 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    local_78 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  l_mcc_record = (opj_simple_mcc_decorrelation_data_t *)local_78;
  if (p_header_size < 2) {
    opj_event_msg(p_manager,1,"Error reading MCC marker\n");
    p_j2k_local._4_4_ = 0;
  }
  else {
    opj_read_bytes_LE(p_header_data,(OPJ_UINT32 *)((long)&l_tcp + 4),2);
    pOStack_20 = pOStack_20 + 2;
    if (l_tcp._4_4_ == 0) {
      if (p_manager_local._4_4_ < 7) {
        opj_event_msg(_j,1,"Error reading MCC marker\n");
        p_j2k_local._4_4_ = 0;
      }
      else {
        opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)&l_tcp,1);
        pOStack_20 = pOStack_20 + 1;
        l_mct_data = l_mcc_record[0xb1].m_decorrelation_array;
        l_tmp = 0;
        for (; (l_tmp < *(uint *)&l_mcc_record[0xb1].m_offset_array &&
               (l_mct_data->m_element_type != (J2K_MCT_ELEMENT_TYPE)l_tcp));
            l_mct_data = l_mct_data + 1) {
          l_tmp = l_tmp + 1;
        }
        if (l_tmp == *(OPJ_UINT32 *)&l_mcc_record[0xb1].m_offset_array) {
          if (*(int *)&l_mcc_record[0xb1].m_offset_array ==
              *(int *)((long)&l_mcc_record[0xb1].m_offset_array + 4)) {
            *(int *)((long)&l_mcc_record[0xb1].m_offset_array + 4) =
                 *(int *)((long)&l_mcc_record[0xb1].m_offset_array + 4) + 10;
            poVar3 = (opj_mct_data_t *)
                     opj_realloc(l_mcc_record[0xb1].m_decorrelation_array,
                                 (ulong)*(uint *)((long)&l_mcc_record[0xb1].m_offset_array + 4) << 5
                                );
            if (poVar3 == (opj_mct_data_t *)0x0) {
              opj_free(l_mcc_record[0xb1].m_decorrelation_array);
              l_mcc_record[0xb1].m_decorrelation_array = (opj_mct_data_t *)0x0;
              *(undefined4 *)((long)&l_mcc_record[0xb1].m_offset_array + 4) = 0;
              *(undefined4 *)&l_mcc_record[0xb1].m_offset_array = 0;
              opj_event_msg(_j,1,"Not enough memory to read MCC marker\n");
              return 0;
            }
            l_mcc_record[0xb1].m_decorrelation_array = poVar3;
            l_mct_data = l_mcc_record[0xb1].m_decorrelation_array +
                         *(uint *)&l_mcc_record[0xb1].m_offset_array;
            memset(l_mct_data,0,
                   (ulong)(uint)(*(int *)((long)&l_mcc_record[0xb1].m_offset_array + 4) -
                                *(int *)&l_mcc_record[0xb1].m_offset_array) << 5);
          }
          l_mct_data = l_mcc_record[0xb1].m_decorrelation_array +
                       *(uint *)&l_mcc_record[0xb1].m_offset_array;
          bVar1 = true;
        }
        l_mct_data->m_element_type = (J2K_MCT_ELEMENT_TYPE)l_tcp;
        opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)((long)&l_tcp + 4),2);
        pOStack_20 = pOStack_20 + 2;
        if (l_tcp._4_4_ == 0) {
          opj_read_bytes_LE(pOStack_20,&l_nb_bytes_by_comp,2);
          pOStack_20 = pOStack_20 + 2;
          if (l_nb_bytes_by_comp < 2) {
            p_manager_local._4_4_ = p_manager_local._4_4_ - 7;
            for (l_tmp = 0; l_tmp < l_nb_bytes_by_comp; l_tmp = l_tmp + 1) {
              if (p_manager_local._4_4_ < 3) {
                opj_event_msg(_j,1,"Error reading MCC marker\n");
                return 0;
              }
              opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)((long)&l_tcp + 4),1);
              pOStack_20 = pOStack_20 + 1;
              if (l_tcp._4_4_ != 1) {
                opj_event_msg(_j,2,
                              "Cannot take in charge collections other than array decorrelation\n");
                return 1;
              }
              opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)&l_new_mcc,2);
              pOStack_20 = pOStack_20 + 2;
              p_manager_local._4_4_ = p_manager_local._4_4_ - 3;
              uVar2 = ((uint)l_new_mcc >> 0xf) + 1;
              l_mct_data->m_array_type = l_new_mcc & 0x7fff;
              if (p_manager_local._4_4_ < uVar2 * l_mct_data->m_array_type + 2) {
                opj_event_msg(_j,1,"Error reading MCC marker\n");
                return 0;
              }
              p_manager_local._4_4_ = p_manager_local._4_4_ - (uVar2 * l_mct_data->m_array_type + 2)
              ;
              for (l_indix = 0; l_indix < l_mct_data->m_array_type; l_indix = l_indix + 1) {
                opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)((long)&l_tcp + 4),uVar2);
                pOStack_20 = pOStack_20 + uVar2;
                if (l_tcp._4_4_ != l_indix) {
                  opj_event_msg(_j,2,"Cannot take in charge collections with indix shuffle\n");
                  return 1;
                }
              }
              opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)&l_new_mcc,2);
              pOStack_20 = pOStack_20 + 2;
              uVar2 = ((uint)l_new_mcc >> 0xf) + 1;
              l_new_mcc = l_new_mcc & 0x7fff;
              if (l_new_mcc != l_mct_data->m_array_type) {
                opj_event_msg(_j,2,
                              "Cannot take in charge collections without same number of indixes\n");
                return 1;
              }
              if (p_manager_local._4_4_ < uVar2 * l_mct_data->m_array_type + 3) {
                opj_event_msg(_j,1,"Error reading MCC marker\n");
                return 0;
              }
              p_manager_local._4_4_ = p_manager_local._4_4_ - (uVar2 * l_mct_data->m_array_type + 3)
              ;
              for (l_indix = 0; l_indix < l_mct_data->m_array_type; l_indix = l_indix + 1) {
                opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)((long)&l_tcp + 4),uVar2);
                pOStack_20 = pOStack_20 + uVar2;
                if (l_tcp._4_4_ != l_indix) {
                  opj_event_msg(_j,2,"Cannot take in charge collections with indix shuffle\n");
                  return 1;
                }
              }
              opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)((long)&l_tcp + 4),3);
              pOStack_20 = pOStack_20 + 3;
              *(byte *)&l_mct_data->m_data_size =
                   (byte)l_mct_data->m_data_size & 0xfe | (l_tcp._4_4_ >> 0x10 & 1) == 0;
              *(undefined8 *)&l_mct_data->m_index = 0;
              l_mct_data->m_data = (OPJ_BYTE *)0x0;
              l_tcp._0_4_ = l_tcp._4_4_ & 0xff;
              if ((J2K_MCT_ELEMENT_TYPE)l_tcp != 0) {
                _l_nb_comps = *(OPJ_BYTE **)&l_mcc_record[0xb0].field_0x18;
                for (l_indix = 0; l_indix < l_mcc_record[0xb1].m_index; l_indix = l_indix + 1) {
                  if (*(uint *)(_l_nb_comps + 8) == (J2K_MCT_ELEMENT_TYPE)l_tcp) {
                    *(OPJ_BYTE **)&l_mct_data->m_index = _l_nb_comps;
                    break;
                  }
                  _l_nb_comps = _l_nb_comps + 0x20;
                }
                if (*(long *)&l_mct_data->m_index == 0) {
                  opj_event_msg(_j,1,"Error reading MCC marker\n");
                  return 0;
                }
              }
              l_tcp._0_4_ = l_tcp._4_4_ >> 8 & 0xff;
              if ((J2K_MCT_ELEMENT_TYPE)l_tcp != MCT_TYPE_INT16) {
                _l_nb_comps = *(OPJ_BYTE **)&l_mcc_record[0xb0].field_0x18;
                for (l_indix = 0; l_indix < l_mcc_record[0xb1].m_index; l_indix = l_indix + 1) {
                  if (*(J2K_MCT_ELEMENT_TYPE *)(_l_nb_comps + 8) == (J2K_MCT_ELEMENT_TYPE)l_tcp) {
                    l_mct_data->m_data = _l_nb_comps;
                    break;
                  }
                  _l_nb_comps = _l_nb_comps + 0x20;
                }
                if (l_mct_data->m_data == (OPJ_BYTE *)0x0) {
                  opj_event_msg(_j,1,"Error reading MCC marker\n");
                  return 0;
                }
              }
            }
            if (p_manager_local._4_4_ == 0) {
              if (bVar1) {
                *(int *)&l_mcc_record[0xb1].m_offset_array =
                     *(int *)&l_mcc_record[0xb1].m_offset_array + 1;
              }
              p_j2k_local._4_4_ = 1;
            }
            else {
              opj_event_msg(_j,1,"Error reading MCC marker\n");
              p_j2k_local._4_4_ = 0;
            }
          }
          else {
            opj_event_msg(_j,2,"Cannot take in charge multiple collections\n");
            p_j2k_local._4_4_ = 1;
          }
        }
        else {
          opj_event_msg(_j,2,"Cannot take in charge multiple data spanning\n");
          p_j2k_local._4_4_ = 1;
        }
      }
    }
    else {
      opj_event_msg(_j,2,"Cannot take in charge multiple data spanning\n");
      p_j2k_local._4_4_ = 1;
    }
  }
  return p_j2k_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_j2k_read_mcc(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 i, j;
    OPJ_UINT32 l_tmp;
    OPJ_UINT32 l_indix;
    opj_tcp_t * l_tcp;
    opj_simple_mcc_decorrelation_data_t * l_mcc_record;
    opj_mct_data_t * l_mct_data;
    OPJ_UINT32 l_nb_collections;
    OPJ_UINT32 l_nb_comps;
    OPJ_UINT32 l_nb_bytes_by_comp;
    OPJ_BOOL l_new_mcc = OPJ_FALSE;

    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
            &p_j2k->m_cp.tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;

    if (p_header_size < 2) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
        return OPJ_FALSE;
    }

    /* first marker */
    opj_read_bytes(p_header_data, &l_tmp, 2);                       /* Zmcc */
    p_header_data += 2;
    if (l_tmp != 0) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Cannot take in charge multiple data spanning\n");
        return OPJ_TRUE;
    }

    if (p_header_size < 7) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
        return OPJ_FALSE;
    }

    opj_read_bytes(p_header_data, &l_indix,
                   1); /* Imcc -> no need for other values, take the first */
    ++p_header_data;

    l_mcc_record = l_tcp->m_mcc_records;

    for (i = 0; i < l_tcp->m_nb_mcc_records; ++i) {
        if (l_mcc_record->m_index == l_indix) {
            break;
        }
        ++l_mcc_record;
    }

    /** NOT FOUND */
    if (i == l_tcp->m_nb_mcc_records) {
        if (l_tcp->m_nb_mcc_records == l_tcp->m_nb_max_mcc_records) {
            opj_simple_mcc_decorrelation_data_t *new_mcc_records;
            l_tcp->m_nb_max_mcc_records += OPJ_J2K_MCC_DEFAULT_NB_RECORDS;

            new_mcc_records = (opj_simple_mcc_decorrelation_data_t *) opj_realloc(
                                  l_tcp->m_mcc_records, l_tcp->m_nb_max_mcc_records * sizeof(
                                      opj_simple_mcc_decorrelation_data_t));
            if (! new_mcc_records) {
                opj_free(l_tcp->m_mcc_records);
                l_tcp->m_mcc_records = NULL;
                l_tcp->m_nb_max_mcc_records = 0;
                l_tcp->m_nb_mcc_records = 0;
                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read MCC marker\n");
                return OPJ_FALSE;
            }
            l_tcp->m_mcc_records = new_mcc_records;
            l_mcc_record = l_tcp->m_mcc_records + l_tcp->m_nb_mcc_records;
            memset(l_mcc_record, 0, (l_tcp->m_nb_max_mcc_records - l_tcp->m_nb_mcc_records)
                   * sizeof(opj_simple_mcc_decorrelation_data_t));
        }
        l_mcc_record = l_tcp->m_mcc_records + l_tcp->m_nb_mcc_records;
        l_new_mcc = OPJ_TRUE;
    }
    l_mcc_record->m_index = l_indix;

    /* only one marker atm */
    opj_read_bytes(p_header_data, &l_tmp, 2);                       /* Ymcc */
    p_header_data += 2;
    if (l_tmp != 0) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Cannot take in charge multiple data spanning\n");
        return OPJ_TRUE;
    }

    opj_read_bytes(p_header_data, &l_nb_collections,
                   2);                              /* Qmcc -> number of collections -> 1 */
    p_header_data += 2;

    if (l_nb_collections > 1) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Cannot take in charge multiple collections\n");
        return OPJ_TRUE;
    }

    p_header_size -= 7;

    for (i = 0; i < l_nb_collections; ++i) {
        if (p_header_size < 3) {
            opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
            return OPJ_FALSE;
        }

        opj_read_bytes(p_header_data, &l_tmp,
                       1); /* Xmcci type of component transformation -> array based decorrelation */
        ++p_header_data;

        if (l_tmp != 1) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Cannot take in charge collections other than array decorrelation\n");
            return OPJ_TRUE;
        }

        opj_read_bytes(p_header_data, &l_nb_comps, 2);

        p_header_data += 2;
        p_header_size -= 3;

        l_nb_bytes_by_comp = 1 + (l_nb_comps >> 15);
        l_mcc_record->m_nb_comps = l_nb_comps & 0x7fff;

        if (p_header_size < (l_nb_bytes_by_comp * l_mcc_record->m_nb_comps + 2)) {
            opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
            return OPJ_FALSE;
        }

        p_header_size -= (l_nb_bytes_by_comp * l_mcc_record->m_nb_comps + 2);

        for (j = 0; j < l_mcc_record->m_nb_comps; ++j) {
            opj_read_bytes(p_header_data, &l_tmp,
                           l_nb_bytes_by_comp);      /* Cmccij Component offset*/
            p_header_data += l_nb_bytes_by_comp;

            if (l_tmp != j) {
                opj_event_msg(p_manager, EVT_WARNING,
                              "Cannot take in charge collections with indix shuffle\n");
                return OPJ_TRUE;
            }
        }

        opj_read_bytes(p_header_data, &l_nb_comps, 2);
        p_header_data += 2;

        l_nb_bytes_by_comp = 1 + (l_nb_comps >> 15);
        l_nb_comps &= 0x7fff;

        if (l_nb_comps != l_mcc_record->m_nb_comps) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Cannot take in charge collections without same number of indixes\n");
            return OPJ_TRUE;
        }

        if (p_header_size < (l_nb_bytes_by_comp * l_mcc_record->m_nb_comps + 3)) {
            opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
            return OPJ_FALSE;
        }

        p_header_size -= (l_nb_bytes_by_comp * l_mcc_record->m_nb_comps + 3);

        for (j = 0; j < l_mcc_record->m_nb_comps; ++j) {
            opj_read_bytes(p_header_data, &l_tmp,
                           l_nb_bytes_by_comp);      /* Wmccij Component offset*/
            p_header_data += l_nb_bytes_by_comp;

            if (l_tmp != j) {
                opj_event_msg(p_manager, EVT_WARNING,
                              "Cannot take in charge collections with indix shuffle\n");
                return OPJ_TRUE;
            }
        }

        opj_read_bytes(p_header_data, &l_tmp, 3); /* Wmccij Component offset*/
        p_header_data += 3;

        l_mcc_record->m_is_irreversible = !((l_tmp >> 16) & 1);
        l_mcc_record->m_decorrelation_array = 00;
        l_mcc_record->m_offset_array = 00;

        l_indix = l_tmp & 0xff;
        if (l_indix != 0) {
            l_mct_data = l_tcp->m_mct_records;
            for (j = 0; j < l_tcp->m_nb_mct_records; ++j) {
                if (l_mct_data->m_index == l_indix) {
                    l_mcc_record->m_decorrelation_array = l_mct_data;
                    break;
                }
                ++l_mct_data;
            }

            if (l_mcc_record->m_decorrelation_array == 00) {
                opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                return OPJ_FALSE;
            }
        }

        l_indix = (l_tmp >> 8) & 0xff;
        if (l_indix != 0) {
            l_mct_data = l_tcp->m_mct_records;
            for (j = 0; j < l_tcp->m_nb_mct_records; ++j) {
                if (l_mct_data->m_index == l_indix) {
                    l_mcc_record->m_offset_array = l_mct_data;
                    break;
                }
                ++l_mct_data;
            }

            if (l_mcc_record->m_offset_array == 00) {
                opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                return OPJ_FALSE;
            }
        }
    }

    if (p_header_size != 0) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
        return OPJ_FALSE;
    }

    if (l_new_mcc) {
        ++l_tcp->m_nb_mcc_records;
    }

    return OPJ_TRUE;
}